

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

void bmpmask16toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  int iVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  OPJ_UINT32 OVar13;
  int iVar14;
  OPJ_UINT8 *pOVar15;
  byte bVar16;
  uint uVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  uint in_stack_00000010;
  
  lVar10 = CONCAT44(in_register_0000000c,redMask);
  bVar19 = 0;
  bVar18 = 0;
  iVar9 = 0;
  if (greenMask != 0) {
    iVar9 = 0;
    OVar7 = greenMask;
    bVar18 = 0;
    if ((greenMask & 1) == 0) {
      bVar18 = 0;
      OVar13 = greenMask;
      do {
        OVar7 = OVar13 >> 1;
        bVar18 = bVar18 + 1;
        uVar8 = OVar13 & 2;
        OVar13 = OVar7;
      } while (uVar8 == 0);
    }
    uVar11 = (ulong)OVar7;
    do {
      uVar11 = uVar11 >> 1;
      iVar9 = iVar9 + 1;
      uVar8 = OVar7 & 2;
      OVar7 = (OPJ_UINT32)uVar11;
    } while (uVar8 != 0);
  }
  iVar20 = 0;
  if (blueMask != 0) {
    iVar20 = 0;
    bVar19 = 0;
    OVar7 = blueMask;
    if ((blueMask & 1) == 0) {
      bVar19 = 0;
      OVar13 = blueMask;
      do {
        OVar7 = OVar13 >> 1;
        bVar19 = bVar19 + 1;
        uVar8 = OVar13 & 2;
        OVar13 = OVar7;
      } while (uVar8 == 0);
    }
    uVar11 = (ulong)OVar7;
    do {
      uVar11 = uVar11 >> 1;
      iVar20 = iVar20 + 1;
      uVar8 = OVar7 & 2;
      OVar7 = (OPJ_UINT32)uVar11;
    } while (uVar8 != 0);
  }
  bVar12 = 0;
  iVar14 = 0;
  if (alphaMask != 0) {
    iVar14 = 0;
    OVar7 = alphaMask;
    bVar12 = 0;
    if ((alphaMask & 1) == 0) {
      bVar12 = 0;
      OVar13 = alphaMask;
      do {
        OVar7 = OVar13 >> 1;
        bVar12 = bVar12 + 1;
        uVar8 = OVar13 & 2;
        OVar13 = OVar7;
      } while (uVar8 == 0);
    }
    uVar11 = (ulong)OVar7;
    do {
      uVar11 = uVar11 >> 1;
      iVar14 = iVar14 + 1;
      uVar8 = OVar7 & 2;
      OVar7 = (OPJ_UINT32)uVar11;
    } while (uVar8 != 0);
  }
  bVar16 = 0;
  iVar21 = 0;
  if (in_stack_00000010 != 0) {
    iVar21 = 0;
    bVar16 = 0;
    uVar8 = in_stack_00000010;
    if ((in_stack_00000010 & 1) == 0) {
      bVar16 = 0;
      uVar17 = in_stack_00000010;
      do {
        uVar8 = uVar17 >> 1;
        bVar16 = bVar16 + 1;
        uVar6 = uVar17 & 2;
        uVar17 = uVar8;
      } while (uVar6 == 0);
    }
    uVar11 = (ulong)uVar8;
    do {
      uVar11 = uVar11 >> 1;
      iVar21 = iVar21 + 1;
      uVar17 = uVar8 & 2;
      uVar8 = (uint)uVar11;
    } while (uVar17 != 0);
  }
  uVar8 = *(uint *)(lVar10 + 8);
  iVar2 = *(int *)(lVar10 + 0xc);
  *(int *)(lVar10 + 0x1c) = iVar9;
  *(int *)(lVar10 + 0x18) = iVar9;
  *(int *)(lVar10 + 0x5c) = iVar20;
  *(int *)(lVar10 + 0x58) = iVar20;
  *(int *)(lVar10 + 0x9c) = iVar14;
  *(int *)(lVar10 + 0x98) = iVar14;
  if (3 < (uint)image) {
    *(int *)(lVar10 + 0xdc) = iVar21;
    *(int *)(lVar10 + 0xd8) = iVar21;
  }
  if (iVar2 != 0) {
    pOVar15 = pData + (iVar2 + -1) * stride;
    iVar20 = 0;
    iVar9 = 0;
    do {
      if ((ulong)uVar8 != 0) {
        lVar1 = (long)iVar20 * 4;
        lVar3 = *(long *)(lVar10 + 0x30);
        lVar4 = *(long *)(lVar10 + 0x70);
        lVar5 = *(long *)(lVar10 + 0xb0);
        iVar20 = iVar20 + uVar8;
        uVar11 = 0;
        do {
          uVar17 = (uint)CONCAT11(pOVar15[(int)uVar11 + 1],pOVar15[uVar11 & 0xffffffff]);
          *(uint *)(lVar3 + lVar1 + uVar11 * 2) = (uVar17 & greenMask) >> (bVar18 & 0x1f);
          *(uint *)(lVar4 + lVar1 + uVar11 * 2) = (uVar17 & blueMask) >> (bVar19 & 0x1f);
          *(uint *)(lVar5 + lVar1 + uVar11 * 2) = (uVar17 & alphaMask) >> (bVar12 & 0x1f);
          if (3 < (uint)image) {
            *(uint *)(*(long *)(lVar10 + 0xf0) + lVar1 + uVar11 * 2) =
                 (uVar17 & in_stack_00000010) >> (bVar16 & 0x1f);
          }
          uVar11 = uVar11 + 2;
        } while ((ulong)uVar8 * 2 != uVar11);
      }
      pOVar15 = pOVar15 + -(ulong)stride;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar2);
  }
  return;
}

Assistant:

static void bmpmask16toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].bpp = redPrec;
    image->comps[0].prec = redPrec;
    image->comps[1].bpp = greenPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].bpp = bluePrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].bpp = alphaPrec;
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[2 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[2 * x + 1]) <<  8;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}